

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O3

void __thiscall PeriodicTable::PeriodicTable(PeriodicTable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element *this_00;
  long lVar2;
  element x;
  element local_80;
  
  (this->table).super__Vector_base<element,_std::allocator<element>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table).super__Vector_base<element,_std::allocator<element>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table).super__Vector_base<element,_std::allocator<element>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_80.name.field_2;
  lVar2 = -0x76;
  do {
    local_80.name._M_string_length = 0;
    local_80.name.field_2._M_local_buf[0] = '\0';
    local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.z = (short)lVar2 + 0x77;
    this_00 = &local_80;
    local_80.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_80);
    addIsotopesTo((PeriodicTable *)this_00,&local_80);
    std::vector<element,_std::allocator<element>_>::push_back(&this->table,&local_80);
    if (local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.half_lives.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.isotopes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.isotopes.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.isotopes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.isotopes.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_80.name._M_dataplus._M_p,
                      CONCAT71(local_80.name.field_2._M_allocated_capacity._1_7_,
                               local_80.name.field_2._M_local_buf[0]) + 1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

PeriodicTable::PeriodicTable()
{
    for(uint16_t z = 1; z <= N_ELEMENTS; z++)
    {
        element x;
        x.z = z;
        x.name = element_names[z];
        addIsotopesTo(x);
        table.push_back(x);
    }
}